

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

string * __thiscall
duckdb::FileHandle::ReadLine_abi_cxx11_(string *__return_storage_ptr__,FileHandle *this)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  bool bVar5;
  bool bVar6;
  char buffer [1];
  undefined8 uStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uStack_38 = in_RAX;
  bVar2 = false;
  do {
    iVar4 = (*this->file_system->_vptr_FileSystem[5])(this->file_system,this,(long)&uStack_38 + 7,1)
    ;
    bVar5 = CONCAT44(extraout_var,iVar4) != 0;
    bVar6 = uStack_38._7_1_ != '\n';
    bVar3 = true;
    if ((bVar6 && bVar5) && (bVar3 = bVar2, uStack_38._7_1_ != '\r')) {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    bVar2 = bVar3;
  } while (bVar6 && bVar5);
  if ((!bVar3) &&
     (pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar1 != &__return_storage_ptr__->field_2)) {
    operator_delete(pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileHandle::ReadLine() {
	string result;
	char buffer[1];
	while (true) {
		auto tuples_read = UnsafeNumericCast<idx_t>(Read(buffer, 1));
		if (tuples_read == 0 || buffer[0] == '\n') {
			return result;
		}
		if (buffer[0] != '\r') {
			result += buffer[0];
		}
	}
}